

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::OneofEnumName_abi_cxx11_
                   (OneofDescriptor *descriptor)

{
  string *__lhs;
  OneofDescriptor *in_RSI;
  string *in_RDI;
  bool in_stack_00000047;
  string *in_stack_00000048;
  Descriptor *fieldDescriptor;
  string *name;
  string *__rhs;
  string local_80 [32];
  string local_60 [32];
  string local_40 [39];
  undefined1 local_19;
  Descriptor *local_18;
  OneofDescriptor *local_10;
  
  __rhs = in_RDI;
  local_10 = in_RSI;
  local_18 = OneofDescriptor::containing_type(in_RSI);
  local_19 = 0;
  ClassName_abi_cxx11_((Descriptor *)in_RDI);
  __lhs = OneofDescriptor::name_abi_cxx11_(local_10);
  anon_unknown_0::UnderscoresToCamelCase(in_stack_00000048,in_stack_00000047);
  std::operator+((char *)__lhs,__rhs);
  std::operator+(__lhs,(char *)__rhs);
  std::__cxx11::string::operator+=((string *)__rhs,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  return in_RDI;
}

Assistant:

string OneofEnumName(const OneofDescriptor* descriptor) {
  const Descriptor* fieldDescriptor = descriptor->containing_type();
  string name = ClassName(fieldDescriptor);
  name += "_" + UnderscoresToCamelCase(descriptor->name(), true) + "_OneOfCase";
  // No sanitize needed because the OS never has names that end in _OneOfCase.
  return name;
}